

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> *
duckdb::LogicalOperator::MapTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          vector<duckdb::LogicalType,_true> *types,vector<unsigned_long,_true> *projection_map)

{
  pointer puVar1;
  pointer puVar2;
  size_type *psVar3;
  const_reference __x;
  vector<duckdb::LogicalType,_true> *result_types;
  size_type *psVar4;
  
  puVar1 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  else {
    (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
    ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
              (&__return_storage_ptr__->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (long)puVar2 - (long)puVar1 >> 3);
    psVar3 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar4 = (projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; psVar4 != psVar3; psVar4 = psVar4 + 1) {
      __x = vector<duckdb::LogicalType,_true>::operator[](types,*psVar4);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&__return_storage_ptr__->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalType> LogicalOperator::MapTypes(const vector<LogicalType> &types, const vector<idx_t> &projection_map) {
	if (projection_map.empty()) {
		return types;
	} else {
		vector<LogicalType> result_types;
		result_types.reserve(projection_map.size());
		for (auto index : projection_map) {
			result_types.push_back(types[index]);
		}
		return result_types;
	}
}